

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avl.c
# Opt level: O3

int avl_insert(avl_tree *tree,avl_node *new)

{
  void *pvVar1;
  _func_int_void_ptr_void_ptr *p_Var2;
  list_entity *plVar3;
  int iVar4;
  avl_node *node;
  avl_node *paVar5;
  avl_node *paVar6;
  
  new->balance = '\0';
  new->follower = false;
  new->parent = (avl_node *)0x0;
  new->left = (avl_node *)0x0;
  new->right = (avl_node *)0x0;
  if (tree->root == (avl_node *)0x0) {
    plVar3 = (tree->list_head).next;
    (new->list).next = plVar3;
    (new->list).prev = &tree->list_head;
    plVar3->prev = &new->list;
    (tree->list_head).next = &new->list;
    tree->root = new;
    tree->count = 1;
  }
  else {
    pvVar1 = new->key;
    p_Var2 = tree->comp;
    paVar5 = tree->root;
    do {
      node = paVar5;
      iVar4 = (*p_Var2)(pvVar1,node->key);
      if (iVar4 < 0) {
        paVar5 = node->left;
      }
      else {
        if (iVar4 == 0) break;
        paVar5 = node->right;
      }
    } while (paVar5 != (avl_node *)0x0);
    iVar4 = (*tree->comp)(new->key,node->key);
    if (iVar4 == 0) {
      if (tree->allow_dups != true) {
        return -1;
      }
      new->follower = true;
      plVar3 = (node->list).next;
      (new->list).next = plVar3;
      (new->list).prev = &node->list;
      plVar3->prev = &new->list;
      (node->list).next = &new->list;
      tree->count = tree->count + 1;
    }
    else {
      new->parent = node;
      if (node->balance == -1) {
        paVar5 = node;
        do {
          paVar6 = paVar5;
          paVar5 = (avl_node *)(paVar6->list).next;
          if ((avl_node *)(tree->list_head).prev == paVar6) break;
        } while (paVar5->follower != false);
        (new->list).next = (list_entity *)paVar5;
        (new->list).prev = &paVar6->list;
        (paVar5->list).prev = &new->list;
        (paVar6->list).next = &new->list;
        tree->count = tree->count + 1;
        node->balance = '\0';
        node->right = new;
      }
      else if (node->balance == '\x01') {
        plVar3 = (node->list).prev;
        (new->list).next = &node->list;
        (new->list).prev = plVar3;
        (node->list).prev = &new->list;
        plVar3->next = &new->list;
        tree->count = tree->count + 1;
        node->balance = '\0';
        node->left = new;
      }
      else {
        if (iVar4 < 0) {
          plVar3 = (node->list).prev;
          (new->list).next = &node->list;
          (new->list).prev = plVar3;
          (node->list).prev = &new->list;
          plVar3->next = &new->list;
          tree->count = tree->count + 1;
          node->balance = -1;
          node->left = new;
        }
        else {
          paVar5 = node;
          do {
            paVar6 = paVar5;
            paVar5 = (avl_node *)(paVar6->list).next;
            if ((avl_node *)(tree->list_head).prev == paVar6) break;
          } while (paVar5->follower != false);
          (new->list).next = (list_entity *)paVar5;
          (new->list).prev = &paVar6->list;
          (paVar5->list).prev = &new->list;
          (paVar6->list).next = &new->list;
          tree->count = tree->count + 1;
          node->balance = '\x01';
          node->right = new;
        }
        _post_insert(tree,node);
      }
    }
  }
  return 0;
}

Assistant:

int
avl_insert(struct avl_tree *tree, struct avl_node *new) {
  struct avl_node *node, *last;
  int diff;

  new->parent = NULL;

  new->left = NULL;
  new->right = NULL;

  new->balance = 0;
  new->follower = false;

  if (tree->root == NULL) {
    list_add_head(&tree->list_head, &new->list);
    tree->root = new;
    tree->count = 1;
    return 0;
  }

  node = _avl_find_rec(tree->root, new->key, tree->comp, &diff);

  diff = (*tree->comp)(new->key, node->key);

  if (diff == 0) {
    if (!tree->allow_dups)
      return -1;

    new->follower = true;

    /* add new node outside the tree, because key is already present */
    _avl_insert_after(tree, node, new);
    return 0;
  }

  new->parent = node;

  if (node->balance == 1) {
    _avl_insert_before(tree, node, new);
    node->balance = 0;
    node->left = new;
    return 0;
  }

  if (node->balance == -1) {
    last = _avl_find_last(tree, node);
    _avl_insert_after(tree, last, new);

    node->balance = 0;
    node->right = new;
    return 0;
  }

  if (diff < 0) {
    _avl_insert_before(tree, node, new);

    node->balance = -1;
    node->left = new;
    _post_insert(tree, node);
  }
  else { /* diff > 0 */
    last = _avl_find_last(tree, node);
    _avl_insert_after(tree, last, new);

    node->balance = 1;
    node->right = new;
    _post_insert(tree, node);
  }
  return 0;
}